

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

void __thiscall BlurayHelper::createBluRayDirs(BlurayHelper *this)

{
  IsoWriter *pIVar1;
  string *psVar2;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->m_dt == BLURAY) {
    pIVar1 = this->m_isoWriter;
    if (pIVar1 == (IsoWriter *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/META",&local_71);
      toNativeSeparators(&local_50,&local_30);
      psVar2 = &this->m_dstPath;
      std::operator+(&local_70,psVar2,&local_50);
      createDir(&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/BDJO",&local_71);
      toNativeSeparators(&local_50,&local_30);
      std::operator+(&local_70,psVar2,&local_50);
      createDir(&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/JAR",&local_71);
      toNativeSeparators(&local_50,&local_30);
      std::operator+(&local_70,psVar2,&local_50);
      createDir(&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"BDMV/BACKUP/BDJO",&local_71);
      toNativeSeparators(&local_50,&local_30);
      std::operator+(&local_70,psVar2,&local_50);
      createDir(&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"BDMV/BACKUP/JAR",&local_71);
      toNativeSeparators(&local_50,&local_30);
      std::operator+(&local_70,psVar2,&local_50);
      createDir(&local_70,true);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      psVar2 = &local_30;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"BDMV/META",(allocator<char> *)&local_50);
      IsoWriter::createDir(pIVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar1 = this->m_isoWriter;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"BDMV/BDJO",(allocator<char> *)&local_50);
      IsoWriter::createDir(pIVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar1 = this->m_isoWriter;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"BDMV/JAR",(allocator<char> *)&local_50);
      IsoWriter::createDir(pIVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar1 = this->m_isoWriter;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"BDMV/BACKUP/BDJO",(allocator<char> *)&local_50);
      IsoWriter::createDir(pIVar1,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      pIVar1 = this->m_isoWriter;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"BDMV/BACKUP/JAR",(allocator<char> *)&local_50);
      IsoWriter::createDir(pIVar1,&local_70);
      psVar2 = &local_70;
    }
    std::__cxx11::string::~string((string *)psVar2);
  }
  pIVar1 = this->m_isoWriter;
  if (pIVar1 == (IsoWriter *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CERTIFICATE/BACKUP",&local_71);
    toNativeSeparators(&local_50,&local_30);
    psVar2 = &this->m_dstPath;
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/AUXDATA",&local_71)
    ;
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/CLIPINF",&local_71)
    ;
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"BDMV/PLAYLIST",&local_71);
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BDMV/STREAM",&local_71);
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"BDMV/BACKUP/CLIPINF",&local_71);
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"BDMV/BACKUP/PLAYLIST",&local_71);
    toNativeSeparators(&local_50,&local_30);
    std::operator+(&local_70,psVar2,&local_50);
    createDir(&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    psVar2 = &local_30;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CERTIFICATE/BACKUP",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/AUXDATA",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/CLIPINF",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/PLAYLIST",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/STREAM",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/BACKUP/CLIPINF",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pIVar1 = this->m_isoWriter;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"BDMV/BACKUP/PLAYLIST",(allocator<char> *)&local_50);
    IsoWriter::createDir(pIVar1,&local_70);
    psVar2 = &local_70;
  }
  std::__cxx11::string::~string((string *)psVar2);
  return;
}

Assistant:

void BlurayHelper::createBluRayDirs() const
{
    if (m_dt == DiskType::BLURAY)
    {
        if (m_isoWriter)
        {
            m_isoWriter->createDir("BDMV/META");
            m_isoWriter->createDir("BDMV/BDJO");
            m_isoWriter->createDir("BDMV/JAR");
            m_isoWriter->createDir("BDMV/BACKUP/BDJO");
            m_isoWriter->createDir("BDMV/BACKUP/JAR");
        }
        else
        {
            createDir(m_dstPath + toNativeSeparators("BDMV/META"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BDJO"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/JAR"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/BDJO"), true);
            createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/JAR"), true);
        }
    }

    if (m_isoWriter)
    {
        m_isoWriter->createDir("CERTIFICATE/BACKUP");
        m_isoWriter->createDir("BDMV/AUXDATA");

        m_isoWriter->createDir("BDMV/CLIPINF");
        m_isoWriter->createDir("BDMV/PLAYLIST");
        m_isoWriter->createDir("BDMV/STREAM");
        m_isoWriter->createDir("BDMV/BACKUP/CLIPINF");
        m_isoWriter->createDir("BDMV/BACKUP/PLAYLIST");
    }
    else
    {
        createDir(m_dstPath + toNativeSeparators("CERTIFICATE/BACKUP"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/AUXDATA"), true);

        createDir(m_dstPath + toNativeSeparators("BDMV/CLIPINF"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/PLAYLIST"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/STREAM"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/CLIPINF"), true);
        createDir(m_dstPath + toNativeSeparators("BDMV/BACKUP/PLAYLIST"), true);
    }
}